

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2202::floatffArithmeticTest_ResultHasCorrectType_Test::TestBody
          (floatffArithmeticTest_ResultHasCorrectType_Test *this)

{
  floatff flhs;
  doubleff dlhs;
  flexfloat<(unsigned_char)__b_,_(unsigned_char)__x17_> fStack_28;
  flexfloat<(unsigned_char)__v_,_(unsigned_char)_4_> local_18;
  
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)11,(unsigned_char)52>,flexfloat<(unsigned_char)11,(unsigned_char)52>>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)11,(unsigned_char)52>,flexfloat<(unsigned_char)11,(unsigned_char)52>>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)11,(unsigned_char)52>,flexfloat<(unsigned_char)11,(unsigned_char)52>>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)11,(unsigned_char)52>,flexfloat<(unsigned_char)11,(unsigned_char)52>>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)8,(unsigned_char)23>,flexfloat<(unsigned_char)8,(unsigned_char)23>>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)8,(unsigned_char)23>,flexfloat<(unsigned_char)8,(unsigned_char)23>>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)8,(unsigned_char)23>,flexfloat<(unsigned_char)8,(unsigned_char)23>>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)8,(unsigned_char)23>,flexfloat<(unsigned_char)8,(unsigned_char)23>>
            ();
  flexfloat<(unsigned_char)'\v',_(unsigned_char)'4'>::flexfloat(&local_18);
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)11,(unsigned_char)52>&,flexfloat<(unsigned_char)11,(unsigned_char)52>&>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)11,(unsigned_char)52>&,flexfloat<(unsigned_char)11,(unsigned_char)52>&>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)11,(unsigned_char)52>&,flexfloat<(unsigned_char)11,(unsigned_char)52>&>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)11,(unsigned_char)52>&,flexfloat<(unsigned_char)11,(unsigned_char)52>&>
            ();
  flexfloat<(unsigned_char)'\b',_(unsigned_char)'\x17'>::flexfloat(&fStack_28);
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)8,(unsigned_char)23>&,flexfloat<(unsigned_char)8,(unsigned_char)23>&>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)8,(unsigned_char)23>&,flexfloat<(unsigned_char)8,(unsigned_char)23>&>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)8,(unsigned_char)23>&,flexfloat<(unsigned_char)8,(unsigned_char)23>&>
            ();
  testing::
  StaticAssertTypeEq<flexfloat<(unsigned_char)8,(unsigned_char)23>&,flexfloat<(unsigned_char)8,(unsigned_char)23>&>
            ();
  return;
}

Assistant:

TEST(floatffArithmeticTest, ResultHasCorrectType)
{
    using doubleff = flexfloat<11, 52>;
    using floatff = flexfloat<8, 23>;

    ::testing::StaticAssertTypeEq<doubleff, decltype(doubleff() + doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff, decltype(doubleff() - doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff, decltype(doubleff() * doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff, decltype(doubleff() / doubleff())>();

    ::testing::StaticAssertTypeEq<floatff, decltype(floatff() + floatff())>();
    ::testing::StaticAssertTypeEq<floatff, decltype(floatff() - floatff())>();
    ::testing::StaticAssertTypeEq<floatff, decltype(floatff() * floatff())>();
    ::testing::StaticAssertTypeEq<floatff, decltype(floatff() / floatff())>();

    doubleff dlhs;
    ::testing::StaticAssertTypeEq<doubleff&, decltype(dlhs += doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff&, decltype(dlhs -= doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff&, decltype(dlhs *= doubleff())>();
    ::testing::StaticAssertTypeEq<doubleff&, decltype(dlhs /= doubleff())>();
    floatff flhs;
    ::testing::StaticAssertTypeEq<floatff&, decltype(flhs += floatff())>();
    ::testing::StaticAssertTypeEq<floatff&, decltype(flhs -= floatff())>();
    ::testing::StaticAssertTypeEq<floatff&, decltype(flhs *= floatff())>();
    ::testing::StaticAssertTypeEq<floatff&, decltype(flhs /= floatff())>();
}